

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c14n.c
# Opt level: O2

int xmlC14NDocSaveTo(xmlDocPtr doc,xmlNodeSetPtr nodes,int mode,xmlChar **inclusive_ns_prefixes,
                    int with_comments,xmlOutputBufferPtr buf)

{
  int iVar1;
  
  iVar1 = xmlC14NExecute(doc,xmlC14NIsNodeInNodeset,nodes,mode,inclusive_ns_prefixes,with_comments,
                         buf);
  return iVar1;
}

Assistant:

int
xmlC14NDocSaveTo(xmlDocPtr doc, xmlNodeSetPtr nodes,
                 int mode, xmlChar ** inclusive_ns_prefixes,
                 int with_comments, xmlOutputBufferPtr buf) {
    return(xmlC14NExecute(doc,
			xmlC14NIsNodeInNodeset,
			nodes,
			mode,
			inclusive_ns_prefixes,
			with_comments,
			buf));
}